

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

bool __thiscall gmlc::utilities::nonNumericFirstOrLastCharacter(utilities *this,string_view V)

{
  byte bVar1;
  
  bVar1 = 1;
  if ((this != (utilities *)0x0) && (numCheck[*(byte *)V._M_len] == '\x01')) {
    bVar1 = numCheckEnd[((byte *)V._M_len + -1)[(long)this]] ^ 1;
  }
  return (bool)bVar1;
}

Assistant:

inline bool nonNumericFirstOrLastCharacter(std::string_view V)
{
    return (
        (V.empty()) || (numCheck[V[0]] == false) ||
        (numCheckEnd[V.back()] == false));
}